

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accumulator.hpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>::getVariance
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          Accumulator<std::vector<double,_std::allocator<double>_>_> *this)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  allocator_type local_11;
  
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,
             (long)(this->Avg_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->Avg_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_11);
  pdVar1 = (this->Avg_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->Avg_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar3 = (this->Avg2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar5 = 0; uVar5 < (ulong)((long)pdVar2 - (long)pdVar1 >> 3); uVar5 = uVar5 + 1) {
    dVar7 = pdVar1[uVar5];
    dVar6 = pdVar3[uVar5] - dVar7 * dVar7;
    dVar7 = 0.0;
    if (0.0 <= dVar6) {
      dVar7 = dVar6;
    }
    pdVar4[uVar5] = dVar7;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<RealType> getVariance() const {
      std::vector<RealType> var(Avg_.size());

      for (std::size_t i = 0; i < Avg_.size(); i++) {
        var[i] = (Avg2_[i] - Avg_[i] * Avg_[i]);
        if (var[i] < 0) var[i] = 0;
      }

      return var;
    }